

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O1

us_poll_t * us_poll_resize(us_poll_t *p,us_loop_t *loop,uint ext_size)

{
  undefined1 *puVar1;
  us_poll_t *p_00;
  long lVar2;
  epoll_data_t *peVar3;
  uint events;
  
  events = (uint)p->state >> 0x1c & 4 | (uint)p->state >> 0x1f;
  p_00 = (us_poll_t *)realloc(p,(ulong)ext_size + 0x10);
  if (events != 0 && p_00 != p) {
    puVar1 = &(p_00->state).field_0x3;
    *puVar1 = *puVar1 & 0x3f;
    us_poll_change(p_00,loop,events);
    lVar2 = (long)loop->current_ready_poll;
    if (loop->current_ready_poll < loop->num_ready_polls) {
      peVar3 = &loop->ready_polls[lVar2].data;
      do {
        lVar2 = lVar2 + 1;
        if ((us_poll_t *)peVar3->ptr == p) {
          peVar3->ptr = p_00;
          return p_00;
        }
        peVar3 = (epoll_data_t *)((long)peVar3 + 0xc);
      } while (lVar2 < loop->num_ready_polls);
    }
  }
  return p_00;
}

Assistant:

struct us_poll_t *us_poll_resize(struct us_poll_t *p, struct us_loop_t *loop, unsigned int ext_size) {
    int events = us_poll_events(p);

    struct us_poll_t *new_p = realloc(p, sizeof(struct us_poll_t) + ext_size);
    if (p != new_p && events) {
#ifdef LIBUS_USE_EPOLL
        /* Hack: forcefully update poll by stripping away already set events */
        new_p->state.poll_type = us_internal_poll_type(new_p);
        us_poll_change(new_p, loop, events);
#else
        /* Forcefully update poll by resetting them with new_p as user data */
        kqueue_change(loop->fd, new_p->state.fd, 0, events, new_p);
#endif

        /* This is needed for epoll also (us_change_poll doesn't update the old poll) */
        us_internal_loop_update_pending_ready_polls(loop, p, new_p, events, events);
    }

    return new_p;
}